

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::ClassEscapePass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,Char *singleton,
          bool *previousSurrogatePart)

{
  StandardChars<char16_t> *pSVar1;
  EncodedChar *pEVar2;
  CharCount n;
  bool bVar3;
  EncodedChar EVar4;
  Char CVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  EVar4 = ECLookahead(this,0);
  if ((EVar4 == L'\0') && (this->inputLim <= this->next)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  bVar3 = StandardChars<char16_t>::IsOctal(this->standardEncodedChars,EVar4);
  if (bVar3) {
    iVar10 = 3;
    uVar11 = 0;
    do {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      uVar6 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
      uVar12 = uVar6 + uVar11 * 8;
      if (0xff < uVar12) break;
      ECConsume(this,1);
      iVar10 = iVar10 + -1;
      uVar11 = uVar12;
      if (iVar10 == 0) break;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      bVar3 = StandardChars<char16_t>::IsOctal(pSVar1,EVar4);
    } while (bVar3);
    CVar5 = Chars<char16_t>::UTC(uVar11 & 0xffff);
    *singleton = CVar5;
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  }
  else {
    pEVar2 = this->tempLocationOfSurrogatePair;
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    CVar5 = NextChar(this);
    bVar3 = false;
    switch(CVar5) {
    case L'b':
      *singleton = L'\b';
      break;
    case L'c':
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      bVar3 = StandardChars<char16_t>::IsLetter(pSVar1,EVar4);
      if (!bVar3) {
        DeferredFailIfUnicode(this,-0x7ff5e9d6);
      }
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      bVar3 = StandardChars<char16_t>::IsWord(pSVar1,EVar4);
      if (bVar3) {
        EVar4 = ECLookahead(this,0);
        CVar5 = Chars<char16_t>::UTC((ushort)EVar4 & 0x1f);
        *singleton = CVar5;
        n = 1;
LAB_00d28235:
        ECConsume(this,n);
      }
      else {
        ECRevert(this,1);
        *singleton = L'\\';
      }
      break;
    case L'd':
    case L's':
    case L'w':
      goto switchD_00d27f1c_caseD_64;
    case L'f':
      *singleton = L'\f';
      break;
    case L'n':
      *singleton = L'\n';
      break;
    case L'r':
      *singleton = L'\r';
      break;
    case L't':
      *singleton = L'\t';
      break;
    case L'u':
      this->tempLocationOfSurrogatePair = pEVar2;
      iVar10 = TryParseExtendedUnicodeEscape(this,singleton,previousSurrogatePart,true);
      if (0 < iVar10) {
        return true;
      }
      if (this->next + 4 <= this->inputLim) {
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,0);
        bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,1);
          bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
          if (bVar3) {
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,2);
            bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
            if (bVar3) {
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,3);
              bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
              if (bVar3) {
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,0);
                uVar6 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,1);
                uVar7 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,2);
                uVar8 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,3);
                uVar9 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
                CVar5 = Chars<char16_t>::UTC(uVar8 << 4 | uVar9 | uVar6 << 0xc | uVar7 << 8);
                *singleton = CVar5;
                if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
                  TrackIfSurrogatePair(this,(uint)(ushort)CVar5,this->next + -1,5);
                }
                ECConsume(this,4);
                return true;
              }
            }
          }
        }
      }
      *singleton = L'u';
      return true;
    case L'v':
      *singleton = L'\v';
      break;
    case L'x':
      if (this->next + 2 <= this->inputLim) {
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,0);
        bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,1);
          bVar3 = StandardChars<char16_t>::IsHex(pSVar1,EVar4);
          if (bVar3) {
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,0);
            uVar6 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,1);
            uVar7 = StandardChars<char16_t>::DigitValue(pSVar1,EVar4);
            CVar5 = Chars<char16_t>::UTC(uVar6 << 4 | uVar7);
            *singleton = CVar5;
            n = 2;
            goto LAB_00d28235;
          }
        }
      }
      *singleton = L'x';
      break;
    default:
      if (CVar5 == L'D') {
        return false;
      }
      if (CVar5 == L'S') {
        return false;
      }
      if (CVar5 == L'W') {
        return false;
      }
    case L'e':
    case L'g':
    case L'h':
    case L'i':
    case L'j':
    case L'k':
    case L'l':
    case L'm':
    case L'o':
    case L'p':
    case L'q':
      *singleton = CVar5;
    }
  }
  bVar3 = true;
switchD_00d27f1c_caseD_64:
  return bVar3;
}

Assistant:

bool Parser<P, IsLiteral>::ClassEscapePass0(Char& singleton, bool& previousSurrogatePart)
    {
        // Could be terminating 0
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsOctal(ec))
        {
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            singleton = UTC((UChar)n);
            // Clear possible pair
            this->tempLocationOfSurrogatePair = nullptr;
            return true;
        }
        else
        {
            const EncodedChar* location = this->tempLocationOfSurrogatePair;
            // Clear it for now, otherwise to many branches to clear it on.
            this->tempLocationOfSurrogatePair = nullptr;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                singleton = '\b';
                return true;
            case 'f':
                singleton = '\f';
                return true;
            case 'n':
                singleton = '\n';
                return true;
            case 'r':
                singleton = '\r';
                return true;
            case 't':
                singleton = '\t';
                return true;
            case 'v':
                singleton = '\v';
                return true;
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                return false;
            case 'c':
                if (!standardEncodedChars->IsLetter(ECLookahead())) //Letter set [A-Z, a-z]
                {
                    // Fail in unicode mode for non-letter escaped control characters according to 262 Annex-B RegExp grammar spec #prod-annexB-Term 
                    DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                }

                if (standardEncodedChars->IsWord(ECLookahead())) // word set [A-Z,a-z,0-9,_], terminating 0 is not a word character
                {
                    singleton = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    singleton = '\\';
                }
                return true;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                }
                else
                    singleton = c;
                return true;
            case 'u':
                this->tempLocationOfSurrogatePair = location;
                if (this->TryParseExtendedUnicodeEscape(singleton, previousSurrogatePart, true) > 0)
                    return true;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        // Current location
                        TrackIfSurrogatePair(singleton, (next - 1), 5);
                    }
                    // The above if statement, if true, will clear tempLocationOfSurrogatePair if needs to.
                    ECConsume(4);
                }
                else
                    singleton = c;
                return true;
            default:
                // embedded 0 is ok
                singleton = c;
                return true;
            }
        }
    }